

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown4_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  int iVar1;
  
  if (1 < dst_width) {
    iVar1 = 0;
    do {
      *dst = src_ptr[2];
      dst[1] = src_ptr[6];
      dst = dst + 2;
      src_ptr = src_ptr + 8;
      iVar1 = iVar1 + 2;
    } while (iVar1 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *dst = src_ptr[2];
  }
  return;
}

Assistant:

void ScaleRowDown4_C(const uint8_t* src_ptr,
                     ptrdiff_t src_stride,
                     uint8_t* dst,
                     int dst_width) {
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src_ptr[2];
    dst[1] = src_ptr[6];
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = src_ptr[2];
  }
}